

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O0

void __thiscall Cache::printStatistics(Cache *this)

{
  Cache *in_RDI;
  
  printf("--------- STATISTICS -----------\n");
  printf("Num Read: %d\n",(ulong)(in_RDI->statistics).read_cnt);
  printf("Num Write: %d\n",(ulong)(in_RDI->statistics).write_cnt);
  printf("Num Hit: %d\n",(ulong)(in_RDI->statistics).hit_cnt);
  printf("Num Miss: %d\n",(ulong)(in_RDI->statistics).miss_cnt);
  printf("Total Cycles: %u\n",(ulong)(in_RDI->statistics).cycle_cnt);
  if (in_RDI->lower_cache != (Cache *)0x0) {
    printf("----------- LOWER CACHE -----------\n");
    printStatistics(in_RDI);
  }
  return;
}

Assistant:

void Cache::printStatistics() {
    printf("--------- STATISTICS -----------\n");
    printf("Num Read: %d\n", this->statistics.read_cnt);
    printf("Num Write: %d\n", this->statistics.write_cnt);
    printf("Num Hit: %d\n", this->statistics.hit_cnt);
    printf("Num Miss: %d\n", this->statistics.miss_cnt);
    printf("Total Cycles: %u\n", this->statistics.cycle_cnt);
    if (this->lower_cache != nullptr) {
        printf("----------- LOWER CACHE -----------\n");
        this->lower_cache->printStatistics();
    }
}